

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O0

gc_heap_ptr<mjs::function_object> __thiscall
mjs::gc_heap::unsafe_track<mjs::function_object>(gc_heap *this,function_object *val)

{
  slot *psVar1;
  long lVar2;
  long in_RDX;
  gc_heap_ptr<mjs::function_object> gVar3;
  bool local_29;
  long pos;
  function_object *val_local;
  gc_heap *this_local;
  
  psVar1 = allocation_context::storage
                     ((allocation_context *)&(val->super_native_object).super_object.class_);
  lVar2 = in_RDX - (long)psVar1 >> 3;
  local_29 = false;
  if ((0 < lVar2) && (local_29 = false, lVar2 < 0xffffffff)) {
    local_29 = allocation_context::pos_inside
                         ((allocation_context *)&(val->super_native_object).super_object.class_,
                          (uint32_t)lVar2);
  }
  if (local_29 == false) {
    __assert_fail("pos >= 1 && pos < UINT32_MAX && alloc_context_.pos_inside(static_cast<uint32_t>(pos))"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h"
                  ,0x208,
                  "gc_heap_ptr<T> mjs::gc_heap::unsafe_track(const T &) [T = mjs::function_object]")
    ;
  }
  gVar3 = unsafe_create_from_position<mjs::function_object>(this,(uint32_t)val);
  gVar3.super_gc_heap_ptr_untyped.heap_ = this;
  return (gc_heap_ptr<mjs::function_object>)gVar3.super_gc_heap_ptr_untyped;
}

Assistant:

gc_heap_ptr<T> gc_heap::unsafe_track(const T& val) {
    auto pos = reinterpret_cast<const slot*>(&val) - alloc_context_.storage();
    assert(pos >= 1 && pos < UINT32_MAX && alloc_context_.pos_inside(static_cast<uint32_t>(pos)));
    return unsafe_create_from_position<T>(static_cast<uint32_t>(pos));
}